

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::FileStream::FileStream(FileStream *this,string *filename)

{
  ostream *poVar1;
  domain_error *this_00;
  ofstream *this_01;
  string asStack_1b8 [32];
  ostringstream oss;
  
  (this->super_IStream)._vptr_IStream = (_func_int **)&PTR__FileStream_0018e9c0;
  this_01 = &this->m_ofs;
  std::ofstream::ofstream(this_01);
  std::ofstream::open((char *)this_01,(_Ios_Openmode)(filename->_M_dataplus)._M_p);
  if (((&this->field_0x28)[*(long *)(*(long *)this_01 + -0x18)] & 5) == 0) {
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,"Unable to open file: \'");
  poVar1 = std::operator<<(poVar1,(string *)filename);
  std::operator<<(poVar1,"\'");
  this_00 = (domain_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::domain_error::domain_error(this_00,asStack_1b8);
  __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
}

Assistant:

FileStream::FileStream( std::string const& filename ) {
        m_ofs.open( filename.c_str() );
        if( m_ofs.fail() ) {
            std::ostringstream oss;
            oss << "Unable to open file: '" << filename << "'";
            throw std::domain_error( oss.str() );
        }
    }